

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::DatabaseBackedPoolTest_ErrorWithoutErrorCollector_Test::
DatabaseBackedPoolTest_ErrorWithoutErrorCollector_Test
          (DatabaseBackedPoolTest_ErrorWithoutErrorCollector_Test *this)

{
  DatabaseBackedPoolTest_ErrorWithoutErrorCollector_Test *this_local;
  
  DatabaseBackedPoolTest::DatabaseBackedPoolTest(&this->super_DatabaseBackedPoolTest);
  (this->super_DatabaseBackedPoolTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DatabaseBackedPoolTest_ErrorWithoutErrorCollector_Test_029af9c0;
  return;
}

Assistant:

TEST_F(DatabaseBackedPoolTest, ErrorWithoutErrorCollector) {
  ErrorDescriptorDatabase error_database;
  DescriptorPool pool(&error_database);

  {
    absl::ScopedMockLog log;
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_, testing::_))
        .Times(testing::AtLeast(1));
    log.StartCapturingLogs();
    EXPECT_TRUE(pool.FindFileByName("error.proto") == nullptr);
  }
}